

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O1

void test_convert<double,float>(uint length,double value)

{
  float fVar1;
  ulong uVar2;
  void *pvVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  float fVar8;
  shared_ptr<double> pt;
  shared_ptr<float> pu;
  
  uVar2 = (ulong)length;
  uVar5 = (long)(int)length * 8;
  if ((int)length < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  uVar6 = (long)(int)length * 4;
  if ((int)length < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value;
  pvVar3 = operator_new__(uVar5);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<double*,void(*)(double*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pt,pvVar3,nosimd::common::free<double>);
  pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar6);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<float*,void(*)(float*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pu,
             pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<float>);
  if (0 < (int)length) {
    uVar5 = 0;
    do {
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar3 + uVar5 * 8) =
           pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
    if (0 < (int)length) {
      uVar5 = 0;
      do {
        *(float *)((long)&(pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + uVar5 * 4) =
             (float)*(double *)((long)pvVar3 + uVar5 * 8);
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
    }
  }
  if (length != 0) {
    uVar5 = 0;
    do {
      fVar1 = *(float *)((long)&(pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar5 * 4);
      fVar8 = fVar1 - (float)(double)pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi;
      uVar7 = -(uint)(fVar8 < 0.0);
      if (1.1920929e-07 <=
          (float)(~uVar7 & (uint)fVar8 |
                 (uint)((float)(double)pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount._M_pi - fVar1) & uVar7)) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar4 = "void test_convert(unsigned int, _T) [_T = double, _U = float]";
        *(undefined4 *)(puVar4 + 1) = 0x17;
        *(uint *)((long)puVar4 + 0xc) = length;
        __cxa_throw(puVar4,&Exception::typeinfo,0);
      }
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  if (pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}